

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O0

jieba_token_t *
jieba_tokenize(jieba_t *handle,char *sentence,jieba_tokenize_mode_t mode,int is_hmm_used)

{
  int in_EDX;
  string *in_RSI;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *in_RDI;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> words;
  undefined8 in_stack_ffffffffffffff28;
  undefined1 hmm;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  Jieba *in_stack_ffffffffffffff40;
  undefined1 local_91 [33];
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  allocator local_59;
  string local_58 [60];
  int local_1c;
  string *local_18;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *local_10;
  jieba_token_t *local_8;
  
  hmm = (undefined1)((ulong)in_stack_ffffffffffffff28 >> 0x38);
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::vector
            ((vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)0x14f362);
  if (local_1c == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,(char *)local_18,&local_59);
    cppjieba::Jieba::CutForSearch
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               (bool)hmm);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    local_8 = convert_tokens((vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  }
  else {
    in_stack_ffffffffffffff40 = (Jieba *)local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_91 + 1),(char *)local_18,(allocator *)in_stack_ffffffffffffff40);
    cppjieba::Jieba::Cut(in_stack_ffffffffffffff40,local_18,local_10,(bool)hmm);
    std::__cxx11::string::~string((string *)(local_91 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_91);
    local_8 = convert_tokens((vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  }
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::~vector
            ((vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)in_stack_ffffffffffffff40);
  return local_8;
}

Assistant:

jieba_token_t* jieba_tokenize(jieba_t* handle, const char* sentence, jieba_tokenize_mode_t mode, int is_hmm_used) {
  std::vector<cppjieba::Word> words;
  switch (mode) {
    case JIEBA_TOKENIZE_MODE_SEARCH:
      ((cppjieba::Jieba*)handle)->CutForSearch(sentence, words, is_hmm_used);
      return convert_tokens(words);
    default:
      ((cppjieba::Jieba*)handle)->Cut(sentence, words, is_hmm_used);
      return convert_tokens(words);
  }
}